

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O1

word zzModW2(word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar13 = 0;
  uVar12 = -w % w;
  if (n == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar13 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar13;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar11;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar12;
      auVar9 = auVar3 * auVar6 + auVar9;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar9._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar12;
      uVar11 = SUB168(auVar4 * auVar7,0);
      uVar13 = uVar11 + a[n - 1];
      uVar11 = SUB168(auVar4 * auVar7,8) + auVar9._8_8_ * uVar12 + (ulong)CARRY8(uVar11,a[n - 1]);
      n = n - 1;
    } while (n != 0);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar12;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = w;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar13;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SUB168(auVar2 % auVar1,0);
  auVar10 = auVar5 * auVar8 + auVar10;
  return (auVar10._8_8_ * uVar12 + auVar10._0_8_ % w) % w;
}

Assistant:

word zzModW2(const word a[], size_t n, register word w)
{
	register word r0 = 0;
	register dword r1 = 0;
	register word b;
	// pre
	ASSERT(w > 0);
	ASSERT(w <= WORD_BIT_HALF);
	ASSERT(wwIsValid(a, n));
	// b <- B \mod mod
	b = (WORD_MAX - w + 1) % w;
	// (r1 r0) <- \sum_i a[i] b^i
	while (n--)
	{
		r1 *= b;
		r1 += r0;
		r1 *= b;
		r1 += a[n];
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	// нормализация
#ifdef SAFE_FAST
	while (r1 != 0)
	{
		r1 *= b;
		r1 += r0 % w;
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	r0 %= w;
#else
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1;
	r1 >>= B_PER_W;
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1 % w;
#endif
	// очистка и возврат
	r1 = 0, b = w = 0;
	return r0;
}